

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall
QTreeViewPrivate::select
          (QTreeViewPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QTreeViewPrivate *this_00;
  const_iterator o;
  qsizetype qVar5;
  QItemSelectionModel *pQVar6;
  long in_FS_OFFSET;
  int i_1;
  int i;
  int right;
  int left;
  int bottom;
  int top;
  QTreeView *q;
  QModelIndex tl;
  QModelIndex previousParent;
  QModelIndex parent;
  QModelIndex index;
  QStack<QItemSelectionRange> rangeStack;
  QItemSelectionRange currentRange;
  QModelIndex previous;
  const_iterator it;
  QList<std::pair<int,_int>_> colRanges;
  QItemSelection selection;
  QModelIndex *in_stack_fffffffffffffd38;
  QModelIndex *in_stack_fffffffffffffd40;
  QModelIndex *in_stack_fffffffffffffd48;
  QModelIndex *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  QTreeViewPrivate *in_stack_fffffffffffffd60;
  int local_280;
  int local_27c;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  int iVar7;
  QPersistentModelIndex local_238;
  undefined1 *local_230;
  QAbstractItemModel *local_228;
  undefined1 local_190 [64];
  undefined1 local_150 [24];
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  int local_dc;
  undefined1 *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  QPersistentModelIndexData *local_a8;
  undefined1 *local_a0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_98;
  QList<QItemSelectionRange> local_90;
  QItemSelectionRange local_78;
  QPersistentModelIndexData *local_68;
  undefined1 *local_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  pair<int,_int> *local_50;
  const_iterator local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = SUB84(__writefds,0);
  this_00 = (QTreeViewPrivate *)q_func(this);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)0x8fcb06);
  local_27c = viewIndex(this_00,(QModelIndex *)
                                CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  iVar2 = viewIndex(this_00,(QModelIndex *)CONCAT44(local_27c,in_stack_fffffffffffffd98));
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  columnRanges((QTreeViewPrivate *)__readfds,(QModelIndex *)this_00,
               (QModelIndex *)CONCAT44(local_27c,iVar2));
  local_48.i = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
  QList<std::pair<int,_int>_>::const_iterator::const_iterator(&local_48);
  local_50 = (pair<int,_int> *)
             QList<std::pair<int,_int>_>::begin
                       ((QList<std::pair<int,_int>_> *)in_stack_fffffffffffffd40);
  local_48 = (const_iterator)local_50;
  while( true ) {
    o = QList<std::pair<int,_int>_>::end((QList<std::pair<int,_int>_> *)in_stack_fffffffffffffd40);
    bVar1 = QList<std::pair<int,_int>_>::const_iterator::operator!=(&local_48,o);
    if (!bVar1) break;
    QList<std::pair<int,_int>_>::const_iterator::operator*(&local_48);
    QList<std::pair<int,_int>_>::const_iterator::operator*(&local_48);
    local_68 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8fcc44);
    local_78.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffd40);
    local_90.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_90.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_90.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack<QItemSelectionRange>::QStack((QStack<QItemSelectionRange> *)0x8fcca9);
    iVar7 = local_27c;
    for (; local_27c <= iVar2; local_27c = local_27c + 1) {
      local_a8 = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_98.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      modelIndex(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58);
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent(in_stack_fffffffffffffd50);
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      local_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      QModelIndex::parent(in_stack_fffffffffffffd50);
      bVar1 = QModelIndex::isValid(in_stack_fffffffffffffd40);
      if ((bVar1) &&
         (bVar1 = ::operator==(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38), bVar1)) {
        iVar4 = QModelIndex::row((QModelIndex *)&local_68);
        local_dc = QModelIndex::row((QModelIndex *)&local_a8);
        local_dc = iVar4 - local_dc;
        iVar4 = qAbs<int>(&local_dc);
        if (iVar4 < 2) {
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          local_130 = &DAT_aaaaaaaaaaaaaaaa;
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          in_stack_fffffffffffffd60 =
               (QTreeViewPrivate *)(this->super_QAbstractItemViewPrivate).model;
          iVar4 = QItemSelectionRange::top((QItemSelectionRange *)0x8fcf06);
          iVar3 = QItemSelectionRange::left((QItemSelectionRange *)0x8fcf17);
          QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffffd40);
          (**(code **)(*(long *)&(in_stack_fffffffffffffd60->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate + 0x60))
                    (&local_138,in_stack_fffffffffffffd60,iVar4,iVar3,local_150);
          QModelIndex::row((QModelIndex *)&local_a8);
          QModelIndex::sibling
                    (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                     (int)in_stack_fffffffffffffd48);
          QItemSelectionRange::QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40);
          QItemSelectionRange::operator=
                    ((QItemSelectionRange *)in_stack_fffffffffffffd40,
                     (QItemSelectionRange *)in_stack_fffffffffffffd38);
          QItemSelectionRange::~QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffd40);
        }
        else {
          bVar1 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          if (bVar1) {
            QList<QItemSelectionRange>::append
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd40,
                       (parameter_type)in_stack_fffffffffffffd38);
          }
          QModelIndex::row((QModelIndex *)&local_a8);
          QModelIndex::sibling
                    (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                     (int)in_stack_fffffffffffffd48);
          QModelIndex::row((QModelIndex *)&local_a8);
          QModelIndex::sibling
                    (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                     (int)in_stack_fffffffffffffd48);
          QItemSelectionRange::QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40);
          QItemSelectionRange::operator=
                    ((QItemSelectionRange *)in_stack_fffffffffffffd40,
                     (QItemSelectionRange *)in_stack_fffffffffffffd38);
          QItemSelectionRange::~QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffd40);
        }
      }
      else {
        bVar1 = QModelIndex::isValid(in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd5c = in_stack_fffffffffffffd5c & 0xffffff;
        if (bVar1) {
          in_stack_fffffffffffffd50 = (QModelIndex *)(this->super_QAbstractItemViewPrivate).model;
          iVar4 = QModelIndex::row((QModelIndex *)&local_68);
          (**(code **)(*(long *)in_stack_fffffffffffffd50 + 0x60))
                    (local_190,in_stack_fffffffffffffd50,iVar4,0,&local_d8);
          bVar1 = ::operator==(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          in_stack_fffffffffffffd5c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd5c);
        }
        if ((char)(in_stack_fffffffffffffd5c >> 0x18) == '\0') {
          bVar1 = QItemSelectionRange::isValid
                            ((QItemSelectionRange *)
                             CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
          if (bVar1) {
            QList<QItemSelectionRange>::append
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd40,
                       (parameter_type)in_stack_fffffffffffffd38);
          }
          bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x8fd11c);
          if (bVar1) {
            QModelIndex::row((QModelIndex *)&local_a8);
            QModelIndex::sibling
                      (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                       (int)in_stack_fffffffffffffd48);
            QModelIndex::row((QModelIndex *)&local_a8);
            QModelIndex::sibling
                      (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                       (int)in_stack_fffffffffffffd48);
            QItemSelectionRange::QItemSelectionRange
                      ((QItemSelectionRange *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       in_stack_fffffffffffffd40);
            QItemSelectionRange::operator=
                      ((QItemSelectionRange *)in_stack_fffffffffffffd40,
                       (QItemSelectionRange *)in_stack_fffffffffffffd38);
            QItemSelectionRange::~QItemSelectionRange
                      ((QItemSelectionRange *)in_stack_fffffffffffffd40);
          }
          else {
            QStack<QItemSelectionRange>::pop
                      ((QStack<QItemSelectionRange> *)in_stack_fffffffffffffd38);
            QItemSelectionRange::operator=
                      ((QItemSelectionRange *)in_stack_fffffffffffffd40,
                       (QItemSelectionRange *)in_stack_fffffffffffffd38);
            QItemSelectionRange::~QItemSelectionRange
                      ((QItemSelectionRange *)in_stack_fffffffffffffd40);
            QItemSelectionRange::bottomRight(&local_78);
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_238);
            local_a8 = local_238.d;
            local_a0 = local_230;
            local_98.ptr = local_228;
            local_27c = local_27c + -1;
          }
        }
        else {
          QStack<QItemSelectionRange>::push
                    ((QStack<QItemSelectionRange> *)in_stack_fffffffffffffd40,
                     (QItemSelectionRange *)in_stack_fffffffffffffd38);
          QModelIndex::row((QModelIndex *)&local_a8);
          QModelIndex::sibling
                    (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                     (int)in_stack_fffffffffffffd48);
          QModelIndex::row((QModelIndex *)&local_a8);
          QModelIndex::sibling
                    (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
                     (int)in_stack_fffffffffffffd48);
          QItemSelectionRange::QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40);
          QItemSelectionRange::operator=
                    ((QItemSelectionRange *)in_stack_fffffffffffffd40,
                     (QItemSelectionRange *)in_stack_fffffffffffffd38);
          QItemSelectionRange::~QItemSelectionRange
                    ((QItemSelectionRange *)in_stack_fffffffffffffd40);
        }
      }
      local_68 = local_a8;
      local_60 = local_a0;
      local_58.ptr = local_98.ptr;
    }
    bVar1 = QItemSelectionRange::isValid
                      ((QItemSelectionRange *)
                       CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    local_27c = iVar7;
    if (bVar1) {
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd40,
                 (parameter_type)in_stack_fffffffffffffd38);
      local_27c = iVar7;
    }
    local_280 = 0;
    while( true ) {
      in_stack_fffffffffffffd48 = (QModelIndex *)(long)local_280;
      qVar5 = QList<QItemSelectionRange>::size(&local_90);
      if (qVar5 <= (long)in_stack_fffffffffffffd48) break;
      QList<QItemSelectionRange>::at
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd40,
                 (qsizetype)in_stack_fffffffffffffd38);
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffd40,
                 (parameter_type)in_stack_fffffffffffffd38);
      local_280 = local_280 + 1;
    }
    QStack<QItemSelectionRange>::~QStack((QStack<QItemSelectionRange> *)0x8fd31c);
    QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffffd40);
    QList<std::pair<int,_int>_>::const_iterator::operator++(&local_48);
  }
  pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_fffffffffffffd40);
  (**(code **)(*(long *)pQVar6 + 0x70))(pQVar6,&local_28,local_c);
  QList<std::pair<int,_int>_>::~QList((QList<std::pair<int,_int>_> *)0x8fd380);
  QItemSelection::~QItemSelection((QItemSelection *)0x8fd38a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTreeViewPrivate::select(const QModelIndex &topIndex, const QModelIndex &bottomIndex,
                              QItemSelectionModel::SelectionFlags command)
{
    Q_Q(QTreeView);
    QItemSelection selection;
    const int top = viewIndex(topIndex),
        bottom = viewIndex(bottomIndex);

    const QList<std::pair<int, int>> colRanges = columnRanges(topIndex, bottomIndex);
    QList<std::pair<int, int>>::const_iterator it;
    for (it = colRanges.begin(); it != colRanges.end(); ++it) {
        const int left = (*it).first,
            right = (*it).second;

        QModelIndex previous;
        QItemSelectionRange currentRange;
        QStack<QItemSelectionRange> rangeStack;
        for (int i = top; i <= bottom; ++i) {
            QModelIndex index = modelIndex(i);
            QModelIndex parent = index.parent();
            QModelIndex previousParent = previous.parent();
            if (previous.isValid() && parent == previousParent) {
                // same parent
                if (qAbs(previous.row() - index.row()) > 1) {
                    //a hole (hidden index inside a range) has been detected
                    if (currentRange.isValid()) {
                        selection.append(currentRange);
                    }
                    //let's start a new range
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    QModelIndex tl = model->index(currentRange.top(), currentRange.left(),
                        currentRange.parent());
                    currentRange = QItemSelectionRange(tl, index.sibling(index.row(), right));
                }
            } else if (previous.isValid() && parent == model->index(previous.row(), 0, previousParent)) {
                // item is child of previous
                rangeStack.push(currentRange);
                currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
            } else {
                if (currentRange.isValid())
                    selection.append(currentRange);
                if (rangeStack.isEmpty()) {
                    currentRange = QItemSelectionRange(index.sibling(index.row(), left), index.sibling(index.row(), right));
                } else {
                    currentRange = rangeStack.pop();
                    index = currentRange.bottomRight(); //let's resume the range
                    --i; //we process again the current item
                }
            }
            previous = index;
        }
        if (currentRange.isValid())
            selection.append(currentRange);
        for (int i = 0; i < rangeStack.size(); ++i)
            selection.append(rangeStack.at(i));
    }
    q->selectionModel()->select(selection, command);
}